

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_vertex_attribiv(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLint params;
  GLint maxVertexAttribs;
  GLint local_3c;
  string local_38;
  GLuint local_14;
  
  local_3c = -1;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             "");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetVertexAttribiv(&ctx->super_CallLogWrapper,0,0xffffffff,&local_3c);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8869,(GLint *)&local_14);
  glu::CallLogWrapper::glGetVertexAttribiv(&ctx->super_CallLogWrapper,local_14,0x8622,&local_3c);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_vertex_attribiv (NegativeTestContext& ctx)
{
	GLint	params				= -1;
	GLint	maxVertexAttribs;

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetVertexAttribiv(0, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxVertexAttribs);
	ctx.glGetVertexAttribiv(maxVertexAttribs, GL_VERTEX_ATTRIB_ARRAY_ENABLED, &params);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}